

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>
::_swap_at_index(RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>
                 *this,Index columnIndex)

{
  _Prime_rehash_policy *this_00;
  Dimension DVar1;
  Field_operators *pFVar2;
  Entry_constructor *pEVar3;
  __buckets_ptr pp_Var4;
  ulong uVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Hash_node_base *p_Var8;
  ID_index rowIndex2;
  ulong uVar9;
  ID_index rowIndex2_00;
  ID_index rowIndex1;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  __hash_code __code;
  uint local_48;
  Index local_44;
  ulong local_40;
  ulong local_38;
  
  rowIndex2_00 = columnIndex + 1;
  this_00 = &this[4].super_type.map_._M_h._M_rehash_policy;
  local_48 = rowIndex2_00;
  local_44 = columnIndex;
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this_00,&local_44);
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this_00,&local_48);
  DVar1 = (pmVar6->super_Column_dimension_option).dim_;
  (pmVar6->super_Column_dimension_option).dim_ = (pmVar7->super_Column_dimension_option).dim_;
  (pmVar7->super_Column_dimension_option).dim_ = DVar1;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&pmVar6->column_,(node_ptr)&pmVar7->column_);
  pFVar2 = pmVar6->operators_;
  pmVar6->operators_ = pmVar7->operators_;
  pmVar7->operators_ = pFVar2;
  pEVar3 = pmVar6->entryPool_;
  pmVar6->entryPool_ = pmVar7->entryPool_;
  pmVar7->entryPool_ = pEVar3;
  pp_Var4 = (this->super_type).map_._M_h._M_buckets;
  uVar5 = (this->super_type).map_._M_h._M_bucket_count;
  uVar9 = (ulong)columnIndex % uVar5;
  p_Var10 = pp_Var4[uVar9];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var10->_M_nxt, p_Var11 = p_Var10,
     *(Index *)&p_Var10->_M_nxt[1]._M_nxt != columnIndex)) {
    while (p_Var10 = p_Var8, p_Var8 = p_Var10->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar5 != uVar9) ||
         (p_Var11 = p_Var10, *(uint *)&p_Var8[1]._M_nxt == columnIndex)) goto LAB_00154748;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00154748:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var11->_M_nxt;
  }
  rowIndex1 = columnIndex;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    rowIndex1 = *(ID_index *)((long)&p_Var8[1]._M_nxt + 4);
  }
  local_40 = (ulong)rowIndex2_00;
  p_Var10 = pp_Var4[local_40 % uVar5];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var10->_M_nxt, p_Var11 = p_Var10,
     *(uint *)&p_Var10->_M_nxt[1]._M_nxt != rowIndex2_00)) {
    while (p_Var10 = p_Var8, p_Var8 = p_Var10->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar5 != local_40 % uVar5) ||
         (p_Var11 = p_Var10, *(uint *)&p_Var8[1]._M_nxt == rowIndex2_00)) goto LAB_001547b3;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_001547b3:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var11->_M_nxt;
  }
  rowIndex2 = rowIndex2_00;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    rowIndex2 = *(ID_index *)((long)&p_Var8[1]._M_nxt + 4);
  }
  local_38 = (ulong)columnIndex;
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
  ::swap_rows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
               *)&this[2].super_type.map_._M_h._M_element_count,rowIndex1,rowIndex2);
  local_48 = rowIndex2_00;
  local_44 = columnIndex;
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)(this + 8),&local_44);
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)(this + 8),&local_48);
  DVar1 = (pmVar6->super_Column_dimension_option).dim_;
  (pmVar6->super_Column_dimension_option).dim_ = (pmVar7->super_Column_dimension_option).dim_;
  (pmVar7->super_Column_dimension_option).dim_ = DVar1;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&pmVar6->column_,(node_ptr)&pmVar7->column_);
  pFVar2 = pmVar6->operators_;
  pmVar6->operators_ = pmVar7->operators_;
  pmVar7->operators_ = pFVar2;
  pEVar3 = pmVar6->entryPool_;
  pmVar6->entryPool_ = pmVar7->entryPool_;
  pmVar7->entryPool_ = pEVar3;
  pp_Var4 = (this->super_type).map_._M_h._M_buckets;
  uVar5 = (this->super_type).map_._M_h._M_bucket_count;
  p_Var10 = pp_Var4[local_38 % uVar5];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var10->_M_nxt, p_Var11 = p_Var10,
     *(Index *)&p_Var10->_M_nxt[1]._M_nxt != columnIndex)) {
    while (p_Var10 = p_Var8, p_Var8 = p_Var10->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar5 != local_38 % uVar5) ||
         (p_Var11 = p_Var10, *(uint *)&p_Var8[1]._M_nxt == columnIndex)) goto LAB_0015489d;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_0015489d:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var11->_M_nxt;
  }
  if (p_Var8 != (_Hash_node_base *)0x0) {
    columnIndex = *(ID_index *)((long)&p_Var8[1]._M_nxt + 4);
  }
  p_Var10 = pp_Var4[local_40 % uVar5];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var10->_M_nxt, p_Var11 = p_Var10,
     *(uint *)&p_Var10->_M_nxt[1]._M_nxt != rowIndex2_00)) {
    while (p_Var10 = p_Var8, p_Var8 = p_Var10->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar5 != local_40 % uVar5) ||
         (p_Var11 = p_Var10, *(uint *)&p_Var8[1]._M_nxt == rowIndex2_00)) goto LAB_00154904;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00154904:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var11->_M_nxt;
  }
  if (p_Var8 != (_Hash_node_base *)0x0) {
    rowIndex2_00 = *(ID_index *)((long)&p_Var8[1]._M_nxt + 4);
  }
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
  ::swap_rows((Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false>_>_>_>
               *)&this[5].super_type.map_._M_h._M_single_bucket,columnIndex,rowIndex2_00);
  return;
}

Assistant:

inline void RU_vine_swap<Master_matrix>::_swap_at_index(Index columnIndex)
{
  _matrix()->reducedMatrixR_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->reducedMatrixR_.swap_rows(_get_row_id_from_position(columnIndex),
                                       _get_row_id_from_position(columnIndex + 1));
  _matrix()->mirrorMatrixU_.swap_columns(columnIndex, columnIndex + 1);
  _matrix()->mirrorMatrixU_.swap_rows(_get_row_id_from_position(columnIndex),
                                      _get_row_id_from_position(columnIndex + 1));
}